

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.c
# Opt level: O1

void BuildTree(char *rawSourceCode)

{
  ulong uVar1;
  Lexer *lexer_00;
  longlong *scope_00;
  Token TVar2;
  uint len;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ASTList *params;
  ASTNode *nodes;
  void *__s;
  uint totalFuncs;
  ASTNode *pAVar9;
  ASTList *paramItems;
  ASTList *pAStack_190;
  undefined1 auStack_188 [16];
  Lexer lexer;
  Clock clock;
  Scope scope;
  Runner runner;
  
  pAStack_190 = (ASTList *)0x103288;
  StartClock((Clock *)&lexer.currentTokenString);
  lexer_00 = (Lexer *)(auStack_188 + 8);
  pAStack_190 = (ASTList *)0x10329a;
  InitLexer(lexer_00,rawSourceCode);
  pAStack_190 = (ASTList *)0x1032a2;
  len = CountTotalASTTokens(lexer_00);
  pAStack_190 = (ASTList *)0x1032ad;
  ResetLexer(lexer_00);
  pAStack_190 = (ASTList *)0x1032b5;
  iVar3 = CountTotalScopes(lexer_00);
  pAStack_190 = (ASTList *)0x1032c1;
  ResetLexer(lexer_00);
  pAStack_190 = (ASTList *)0x1032c9;
  iVar4 = CountTotalFuncs(lexer_00);
  pAStack_190 = (ASTList *)0x1032d4;
  ResetLexer(lexer_00);
  pAStack_190 = (ASTList *)0x1032dc;
  iVar5 = CountTotalFuncCalls(lexer_00);
  pAStack_190 = (ASTList *)0x1032e7;
  ResetLexer(lexer_00);
  pAStack_190 = (ASTList *)0x1032ef;
  uVar6 = CountTotalParamItems(lexer_00);
  pAStack_190 = (ASTList *)0x1032fa;
  ResetLexer(lexer_00);
  totalFuncs = iVar5 + iVar4;
  params = (ASTList *)(auStack_188 + (ulong)totalFuncs * -0x20);
  paramItems = (ASTList *)((long)params - ((ulong)uVar6 * 0x18 + 0xf & 0xfffffffffffffff0));
  paramItems[-1].size = 0x103338;
  paramItems[-1].nodeId = 0;
  InitParams(params,totalFuncs);
  paramItems[-1].size = 0x103347;
  paramItems[-1].nodeId = 0;
  InitParamItems((ASTListItem *)paramItems,uVar6);
  nodes = (ASTNode *)((long)paramItems - ((ulong)len * 0x38 + 0xf & 0xfffffffffffffff0));
  nodes[-1].meta.funcExpr.params = (ASTList *)0x10336a;
  InitNodes(nodes,len);
  pAVar9 = (ASTNode *)((long)nodes - ((ulong)(iVar3 + 1) * 4 + 0xf & 0xfffffffffffffff0));
  if (-1 < iVar3) {
    uVar8 = 0;
    do {
      uVar1 = uVar8 + 1;
      (&pAVar9->type)[uVar8] = (Token)uVar1;
      uVar8 = uVar1;
    } while (iVar3 + 1 != uVar1);
  }
  scope_00 = &clock.elapsed;
  pAVar9[-1].meta.funcExpr.params = (ASTList *)0x1033ae;
  InitScope((Scope *)scope_00);
  clock.elapsed._4_4_ = len;
  scope._24_8_ = nodes;
  scope.nodeSpot = iVar3;
  scope.nodes = pAVar9;
  scope.scopes = (int *)params;
  scope.params = paramItems;
  scope.scopeLength = totalFuncs;
  scope.paramsLength = uVar6;
  lVar7 = (long)scope.nodeLength;
  scope.nodeLength = scope.nodeLength + 1;
  TVar2 = (&pAVar9->type)[lVar7];
  uVar6 = 0;
  pAVar9[-1].meta.funcExpr.params = (ASTList *)0x1033ff;
  ParseStmtList((Scope *)scope_00,(Lexer *)(auStack_188 + 8),TVar2,false);
  clock.elapsed._0_4_ = 0;
  pAVar9[-1].meta.funcExpr.params = (ASTList *)0x103414;
  EnsureSemantics((Scope *)scope_00,1);
  if (0 < (long)(int)clock.elapsed._4_4_) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (((*(uint *)(scope._24_8_ + lVar7) | 8) == 0x68) ||
         (*(uint *)(scope._24_8_ + lVar7) - 0x40 < 0xb)) {
        uVar6 = uVar6 + 1;
      }
      lVar7 = lVar7 + 0x38;
    } while ((long)(int)clock.elapsed._4_4_ * 0x38 - lVar7 != 0);
  }
  uVar8 = (ulong)uVar6;
  __s = (void *)((long)pAVar9 +
                (-(uVar8 + 0xf & 0xfffffffffffffff0) - (uVar8 * 0x18 + 0xf & 0xfffffffffffffff0)));
  if (0 < (int)uVar6) {
    *(undefined8 *)((long)__s + -8) = 0x103493;
    memset(__s,0,uVar8);
  }
  *(undefined8 *)((long)__s + -8) = 0x1034ad;
  InitRunner((Runner *)&scope.paramItems,(Scope *)&clock.elapsed);
  TVar2 = (scope.nodes)->type;
  *(undefined8 *)((long)__s + -8) = 0x1034bb;
  Run((Runner *)&scope.paramItems,TVar2);
  *(undefined8 *)((long)__s + -8) = 0x1034c7;
  DestroyLexer((Lexer *)(auStack_188 + 8));
  *(undefined8 *)((long)__s + -8) = 0x1034d3;
  DestroyNodes(nodes,len);
  *(undefined8 *)((long)__s + -8) = 0x1034db;
  DestroyScope((Scope *)&clock.elapsed);
  *(undefined8 *)((long)__s + -8) = 0x1034e7;
  EndClock((Clock *)&lexer.currentTokenString);
  return;
}

Assistant:

void BuildTree(char* rawSourceCode){
	Clock clock;
	StartClock(&clock);

	DEBUG_PRINT("\n\n------Starting Program------\n");

	// Build Lexer
	Lexer lexer;
	InitLexer(&lexer, rawSourceCode);

	// Pre-allocate memory
	// The heap is 3,000% slower than just using stack
	// memory. So we are pre-allocating the memory
	// using the stack
	int totalNodes = CountTotalASTTokens(&lexer);
	ResetLexer(&lexer);
	int totalScopes = CountTotalScopes(&lexer);
	ResetLexer(&lexer);
	int totalFuncs = CountTotalFuncs(&lexer);
	ResetLexer(&lexer);
	int totalFuncCalls = CountTotalFuncCalls(&lexer);
	ResetLexer(&lexer);
	int totalParamItems = CountTotalParamItems(&lexer);
	ResetLexer(&lexer);

	// Pre-allocate the different param lists
	ASTList params[totalFuncs + totalFuncCalls];
	ASTListItem paramItems[totalParamItems];
	InitParams(params, totalFuncs + totalFuncCalls);
	InitParamItems(paramItems, totalParamItems);

	// Pre-allocate the different variable types
	ASTNode nodes[totalNodes];
	InitNodes(nodes, totalNodes);

	// Pre-allocate the different scopes
	int scopes[totalScopes + 1];
	for (int i = 0; i < totalScopes + 1; i++) scopes[i] = i + 1;

	// Build the scope
	Scope scope;
	InitScope(&scope);
	scope.nodeLength = totalNodes;
	scope.nodes = nodes;
	scope.scopeLength = totalScopes;
	scope.scopes = scopes;

	scope.params = params;
	scope.paramItems = paramItems;
	scope.paramsLength = totalFuncs + totalFuncCalls;
	scope.paramItemsLength = totalParamItems;

	// Let's build the tree
	ParseStmtList(&scope, &lexer, scope.scopes[scope.scopeSpot++], false);
	scope.nodeSpot = 0;
	EnsureSemantics(&scope, 1);

	#if EXPAND_AST
	char* json = ExpandScope(&scope, 0);
	WriteToFile("compiled.json", json);
	#endif

	int totalVars = 0;
	for (int i = 0; i < scope.nodeLength; i++){
		if (scope.nodes[i].type == VAR ||
				scope.nodes[i].type == RETURN ||
				(scope.nodes[i].type > BEGIN_NUMBER && 
				 scope.nodes[i].type < END_STRING)) totalVars++;
	}

	Runner runner;
	RunnerContext runnerContexts[totalVars];
	runner.contexts = runnerContexts;
	bool contextUsed[totalVars];
	runner.contextUsed = contextUsed;

	for (int i = 0; i < totalVars; i++) {
		runner.contextUsed[i] = false;
	}

	runner.totalContexts = totalVars;
	InitRunner(&runner, &scope);
	Run(&runner, scope.scopes[0]);


	// Cleanup
	DestroyLexer(&lexer);
	DestroyNodes(nodes, totalNodes);
	DestroyScope(&scope);

	EndClock(&clock);
	DEBUG_PRINT("\n\n------Program Completed------\n");
	DEBUG_PRINT("\n\n------Program Stats------\n");
	#if DEBUG == 1
	printf("Time: %lld nanoseconds\n", GetClockNanosecond(&clock));
	
	#endif
}